

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

bool __thiscall Tetris::isValid(Tetris *this,int x,int y,int o)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (x == -1) {
    x = this->blockX;
  }
  if (y == -1) {
    y = this->blockY;
  }
  if (o == -1) {
    o = this->orientation;
  }
  if ((uint)o < 4) {
    uVar3 = 0xffffffffffffffff;
    while (((iVar1 = this->shape[(uint)o][uVar3 * 2 + 2], 0xffffffeb < (iVar1 + x) - 0x15U &&
            (iVar2 = this->shape[(uint)o][uVar3 * 2 + 3], 0xfffffff5 < (iVar2 + y) - 0xbU)) &&
           (this->gameBoard->gridInfo[this->color][(uint)(iVar1 + x)][(uint)(iVar2 + y)] == 0))) {
      uVar3 = uVar3 + 1;
      if (uVar3 == 3) {
        return 2 < uVar3;
      }
    }
  }
  return false;
}

Assistant:

bool Tetris::isValid(int x, int y, int o)
{
    x = x == -1 ? blockX : x;
    y = y == -1 ? blockY : y;
    o = o == -1 ? orientation : o;
    if (o < 0 || o > 3)
        return false;

    int i, tmpX, tmpY;
    for (i = 0; i < 4; i++) {
        tmpX = x + shape[o][2 * i];
        tmpY = y + shape[o][2 * i + 1];
        if (tmpX < 1 || tmpY > MAPWIDTH ||
            tmpY < 1 || tmpX > MAPHEIGHT ||
            gameBoard->gridInfo[color][tmpX][tmpY] != 0)
            return false;
    }
    return true;
}